

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tempseat.c
# Opt level: O3

size_t tempseat_output(Seat *seat,SeatOutputType type,void *data,size_t len)

{
  SeatVtable *pSVar1;
  size_t sVar2;
  SeatVtable *pSVar3;
  _func_void_Seat_ptr_size_t *p_Var4;
  
  bufchain_add((bufchain *)(seat + -9),data,len);
  pSVar1 = seat[-3].vt;
  if ((pSVar1 == (SeatVtable *)0x0) || (*(SeatOutputType *)&pSVar1->eof != type)) {
    p_Var4 = (_func_void_Seat_ptr_size_t *)0x0;
    pSVar1 = (SeatVtable *)safemalloc(1,0x18,0);
    *(SeatOutputType *)&pSVar1->eof = type;
    pSVar1->sent = (_func_void_Seat_ptr_size_t *)0x0;
    pSVar1->output = (_func_size_t_Seat_ptr_SeatOutputType_void_ptr_size_t *)0x0;
    pSVar3 = (SeatVtable *)(seat + -4);
    if (seat[-3].vt != (SeatVtable *)0x0) {
      pSVar3 = seat[-3].vt;
    }
    pSVar3->output = (_func_size_t_Seat_ptr_SeatOutputType_void_ptr_size_t *)pSVar1;
    seat[-3].vt = pSVar1;
  }
  else {
    p_Var4 = pSVar1->sent;
  }
  pSVar1->sent = p_Var4 + len;
  sVar2 = bufchain_size((bufchain *)(seat + -9));
  return sVar2;
}

Assistant:

static size_t tempseat_output(Seat *seat, SeatOutputType type,
                              const void *data, size_t len)
{
    TempSeat *ts = container_of(seat, TempSeat, seat);

    bufchain_add(&ts->output, data, len);

    if (!(ts->outchunk_tail && ts->outchunk_tail->type == type)) {
        struct output_chunk *new_chunk = snew(struct output_chunk);

        new_chunk->type = type;
        new_chunk->size = 0;

        new_chunk->next = NULL;
        if (ts->outchunk_tail)
            ts->outchunk_tail->next = new_chunk;
        else
            ts->outchunk_head = new_chunk;
        ts->outchunk_tail = new_chunk;
    }
    ts->outchunk_tail->size += len;

    return bufchain_size(&ts->output);
}